

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datumtest.cpp
# Opt level: O1

int testDatumFloat(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  size_type sVar5;
  ulong uVar6;
  VRCORETYPE_ID VVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  ulong __n;
  int iVar12;
  long lVar13;
  float extraout_XMM0_Da;
  VRDatumFloat a;
  ostringstream buf;
  string local_260;
  _func_int **local_240;
  _func_int **local_238;
  long *local_230;
  ulong local_228;
  long local_220 [2];
  VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> local_210;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  paVar1 = &local_1a8[0].field_2;
  iVar12 = 0;
  local_238 = (_func_int **)&PTR__VRDatumSpecialized_0014a9b8;
  local_240 = (_func_int **)&PTR__VRDatumSpecialized_0014a3b8;
  do {
    MinVR::VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::VRDatumSpecialized(&local_210,37.123)
    ;
    local_210.super_VRDatum._vptr_VRDatum = local_238;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_210.super_VRDatum.description._M_dataplus._M_p,
               local_210.super_VRDatum.description._M_dataplus._M_p +
               local_210.super_VRDatum.description._M_string_length);
    iVar8 = std::__cxx11::string::compare((char *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    (*local_210.super_VRDatum._vptr_VRDatum[8])(&local_210);
    iVar9 = (*local_210.super_VRDatum._vptr_VRDatum[9])(&local_210);
    VVar7 = local_210.super_VRDatum.type;
    fVar2 = *(float *)CONCAT44(extraout_var,iVar9);
    MinVR::VRDatumFloat::getValueString_abi_cxx11_(local_1a8,(VRDatumFloat *)&local_210);
    iVar9 = std::__cxx11::string::compare((char *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    iVar10 = (*local_210.super_VRDatum._vptr_VRDatum[6])(&local_210);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    MinVR::operator<<((ostream *)local_1a8,(VRDatum_conflict *)&local_210);
    MinVR::VRDatumFloat::getValueString_abi_cxx11_(&local_260,(VRDatumFloat *)&local_210);
    std::__cxx11::stringbuf::str();
    uVar6 = local_228;
    sVar5 = local_260._M_string_length;
    __n = local_260._M_string_length;
    if (local_228 < local_260._M_string_length) {
      __n = local_228;
    }
    if (__n == 0) {
      iVar11 = 0;
    }
    else {
      iVar11 = memcmp(local_260._M_dataplus._M_p,local_230,__n);
    }
    if (iVar11 == 0) {
      lVar13 = sVar5 - uVar6;
      if (lVar13 < -0x7fffffff) {
        lVar13 = -0x80000000;
      }
      if (0x7ffffffe < lVar13) {
        lVar13 = 0x7fffffff;
      }
      iVar11 = (int)lVar13;
    }
    if (local_230 != local_220) {
      operator_delete(local_230,local_220[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_210.super_VRDatum._vptr_VRDatum = local_240;
    p_Var4 = local_210.value.super__List_base<float,_std::allocator<float>_>._M_impl._M_node.
             super__List_node_base._M_next;
    while (p_Var4 != (_List_node_base *)&local_210.value) {
      p_Var3 = p_Var4->_M_next;
      operator_delete(p_Var4,0x18);
      p_Var4 = p_Var3;
    }
    MinVR::VRDatum::~VRDatum(&local_210.super_VRDatum);
    iVar12 = iVar12 + 1;
  } while (iVar12 != 10);
  return (uint)(iVar10 != 0x25) + (uint)(VVar7 != VRCORETYPE_FLOAT) + iVar9 + iVar11 +
         iVar8 + (uint)(extraout_XMM0_Da != 37.123) + (uint)(fVar2 != 37.123);
}

Assistant:

int testDatumFloat() {

  int out = 0;

  LOOP {
    MinVR::VRDatumFloat a = MinVR::VRDatumFloat(37.123f);

    out = a.getDescription().compare("float");

    float b = a.getValue();

    out += (37.123f == b) ? 0 : 1;

    const float* pb = a.getValue();
    out += (37.123f == (*pb)) ? 0 : 1;
    
    out += (a.getType() == MinVR::VRCORETYPE_FLOAT) ? 0 : 1;

    out += a.getValueString().compare("37.123001");

    int j = a.getValue();
    out += (j == 37) ? 0 : 1;

    std::ostringstream buf;
    buf << a;
    out += a.getValueString().compare(buf.str());

    // std::cout << "a:" << a << ",a.getValueString()=" << a.getValueString() << ",buf=" << buf.str() << ",j:" << j << ",out=" << out << std::endl;

  }